

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::RemoveAt(BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int i,int last,uint targetBucket)

{
  Type pSVar1;
  int *piVar2;
  
  pSVar1 = this->entries;
  piVar2 = &pSVar1[(uint)last].
            super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
            super_KeyValueEntry<int,_bool>.
            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
            .super_KeyValueEntryDataLayout2<int,_bool>.next;
  if (last < 0) {
    piVar2 = this->buckets + targetBucket;
  }
  *piVar2 = pSVar1[i].
            super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
            super_KeyValueEntry<int,_bool>.
            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
            .super_KeyValueEntryDataLayout2<int,_bool>.next;
  pSVar1[i].super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
  super_KeyValueEntry<int,_bool>.
  super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>.
  super_KeyValueEntryDataLayout2<int,_bool>.value = false;
  pSVar1[i].super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
  super_KeyValueEntry<int,_bool>.
  super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>.
  super_KeyValueEntryDataLayout2<int,_bool>.key = 0;
  SetNextFreeEntryIndex(this,pSVar1 + i,-(uint)(this->freeCount == 0) | this->freeList);
  this->freeList = i;
  this->freeCount = this->freeCount + 1;
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Remove(this->stats,this->buckets[targetBucket] == -1);
    return;
  }
  return;
}

Assistant:

inline void RemoveAt(const int i, const int last, const uint targetBucket)
        {
            if (last < 0)
            {
                buckets[targetBucket] = entries[i].next;
            }
            else
            {
                entries[last].next = entries[i].next;
            }
            entries[i].Clear();
            SetNextFreeEntryIndex(entries[i], freeCount == 0 ? -1 : freeList);
            freeList = i;
            freeCount++;
#if PROFILE_DICTIONARY
            if (stats)
                stats->Remove(buckets[targetBucket] == -1);
#endif
        }